

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O1

_Bool sftp_recvdata(char *buf,size_t len)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  
  bVar3 = len == 0;
  do {
    if (bVar3) {
      return bVar3;
    }
    while (sVar2 = bufchain_size(&received_data), sVar2 == 0) {
      iVar1 = (*backend->vt->exitcode)(backend);
      if (-1 < iVar1) {
        return bVar3;
      }
      iVar1 = ssh_sftp_loop_iteration();
      if (iVar1 < 0) {
        return bVar3;
      }
    }
    sVar2 = bufchain_fetch_consume_up_to(&received_data,buf,len);
    buf = buf + sVar2;
    len = len - sVar2;
    bVar3 = len == 0;
  } while( true );
}

Assistant:

bool sftp_recvdata(char *buf, size_t len)
{
    while (len > 0) {
        while (bufchain_size(&received_data) == 0) {
            if (backend_exitcode(backend) >= 0 ||
                ssh_sftp_loop_iteration() < 0)
                return false;          /* doom */
        }

        size_t got = bufchain_fetch_consume_up_to(&received_data, buf, len);
        buf += got;
        len -= got;
    }

    return true;
}